

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O2

ostream * operator<<(ostream *out,FlatMap<Point,_double,_PointCmp> *map)

{
  pointer ppVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  pair<Point,_double> *v;
  pointer ppVar5;
  bool bVar6;
  
  std::operator<<(out,"{ ");
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (ppVar5 = (map->vec_).
                super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    pcVar4 = ", ";
    if (bVar6) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(out,pcVar4);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = operator<<(poVar2,ppVar5->first);
    std::operator<<(poVar2,"] -> ");
    std::ostream::_M_insert<double>(ppVar5->second);
  }
  poVar2 = std::operator<<(out," }");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}